

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::RunContStack
          (Matcher *this,Char *input,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack
          ,AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  bool bVar2;
  RestoreLoopCont *this_00;
  undefined4 *puVar3;
  ContTag tag;
  Cont *cont;
  AssertionStack *assertionStack_local;
  ContStack *contStack_local;
  uint8 **instPointer_local;
  CharCount *inputOffset_local;
  Char *input_local;
  Matcher *this_local;
  
  do {
    PopStats(this,contStack,input);
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Pop
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if (this_00 == (RestoreLoopCont *)0x0) {
      return true;
    }
    if (RewindLoopFixedGroupLastIteration < (this_00->super_Cont).tag) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13d3,"(cont->tag >= minContTag && cont->tag <= maxContTag)",
                         "cont->tag >= minContTag && cont->tag <= maxContTag");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    switch((this_00->super_Cont).tag) {
    case Resume:
      bVar2 = ResumeCont::Exec((ResumeCont *)this_00,this,input,inputOffset,instPointer,contStack,
                               assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RestoreLoop:
      bVar2 = RestoreLoopCont::Exec
                        (this_00,this,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                        );
      if (bVar2) {
        return false;
      }
      break;
    case RestoreGroup:
      bVar2 = RestoreGroupCont::Exec
                        ((RestoreGroupCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case ResetGroup:
      bVar2 = ResetGroupCont::Exec
                        ((ResetGroupCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case ResetGroupRange:
      bVar2 = ResetGroupRangeCont::Exec
                        ((ResetGroupRangeCont *)this_00,this,input,inputOffset,instPointer,contStack
                         ,assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RepeatLoop:
      bVar2 = RepeatLoopCont::Exec
                        ((RepeatLoopCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case PopAssertion:
      bVar2 = PopAssertionCont::Exec
                        ((PopAssertionCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RewindLoopFixed:
      bVar2 = RewindLoopFixedCont::Exec
                        ((RewindLoopFixedCont *)this_00,this,input,inputOffset,instPointer,contStack
                         ,assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RewindLoopSet:
      bVar2 = RewindLoopSetCont::Exec
                        ((RewindLoopSetCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RewindLoopSetWithFollowFirst:
      bVar2 = RewindLoopSetWithFollowFirstCont::Exec
                        ((RewindLoopSetWithFollowFirstCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    case RewindLoopFixedGroupLastIteration:
      bVar2 = RewindLoopFixedGroupLastIterationCont::Exec
                        ((RewindLoopFixedGroupLastIterationCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      if (bVar2) {
        return false;
      }
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13dc,"(false)","false");
      if (bVar2) {
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        return false;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  } while( true );
}

Assistant:

inline bool Matcher::RunContStack(const Char* const input, CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks)
    {
        while (true)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            PopStats(contStack, input);
#endif
            Cont* cont = contStack.Pop();
            if (cont == 0)
            {
                break;
            }

            Assert(cont->tag >= minContTag && cont->tag <= maxContTag);
            // All these cases RESUME EXECUTION if backtracking finds a stop point
            const Cont::ContTag tag = cont->tag;
            switch (tag)
            {
#define M(O) case Cont::ContTag::O: if (((O##Cont*)cont)->Exec(*this, input, inputOffset, instPointer, contStack, assertionStack, qcTicks)) return false; break;
#include "RegexContcodes.h"
#undef M
            default:
                Assert(false); // should never be reached
                return false;  // however, can't use complier optimization if we wnat to return false here
            }
        }
        return true;
    }